

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddCol(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *objValue,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *lowerValue,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *colVec,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *upperValue,bool scale)

{
  long lVar1;
  int iVar2;
  int iVar3;
  pointer pnVar4;
  bool bVar5;
  int iVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  long lVar8;
  long lVar9;
  Item *pIVar10;
  pointer pnVar11;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar12;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar13;
  soplex *psVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  long in_FS_OFFSET;
  byte bVar17;
  int idx;
  uint local_488;
  int local_47c;
  Item *local_478;
  undefined8 uStack_470;
  DataKey local_460;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_458;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_3d8;
  soplex local_230 [112];
  int local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  soplex local_1b0 [112];
  int local_140;
  undefined1 local_13c;
  undefined8 local_138;
  soplex local_130 [112];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  soplex local_b0 [112];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar17 = 0;
  iVar2 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar3 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_458.m_backend.data._M_elems[0] = 0;
  local_3d8.left.m_backend.data._M_elems[0] = 0;
  local_3d8.left.m_backend.data._M_elems[1] = 0xffffffff;
  local_47c = iVar2;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(&this->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ,(DataKey *)&local_3d8,objValue,lowerValue,colVec,upperValue,(int *)&local_458);
  if (this->thesense != MAXIMIZE) {
    local_3d8.left.m_backend.data._M_elems[0] = 0xffffffff;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
    ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  *)((this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar2),(int *)&local_3d8);
  }
  if (scale) {
    local_488 = (*this->lp_scaler->_vptr_SPxScaler[1])
                          (this->lp_scaler,colVec,
                           &(this->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp);
    pcVar16 = &(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend;
    ::soplex::infinity::__tls_init();
    local_478 = *(Item **)(in_FS_OFFSET + -8);
    local_3d8.left.m_backend.fpclass = cpp_dec_float_finite;
    local_3d8.left.m_backend.prec_elem = 0x1c;
    local_3d8.left.m_backend.data._M_elems[0] = 0;
    local_3d8.left.m_backend.data._M_elems[1] = 0;
    local_3d8.left.m_backend.data._M_elems[2] = 0;
    local_3d8.left.m_backend.data._M_elems[3] = 0;
    local_3d8.left.m_backend.data._M_elems[4] = 0;
    local_3d8.left.m_backend.data._M_elems[5] = 0;
    local_3d8.left.m_backend.data._M_elems[6] = 0;
    local_3d8.left.m_backend.data._M_elems[7] = 0;
    local_3d8.left.m_backend.data._M_elems[8] = 0;
    local_3d8.left.m_backend.data._M_elems[9] = 0;
    local_3d8.left.m_backend.data._M_elems[10] = 0;
    local_3d8.left.m_backend.data._M_elems[0xb] = 0;
    local_3d8.left.m_backend.data._M_elems[0xc] = 0;
    local_3d8.left.m_backend.data._M_elems[0xd] = 0;
    local_3d8.left.m_backend.data._M_elems[0xe] = 0;
    local_3d8.left.m_backend.data._M_elems[0xf] = 0;
    local_3d8.left.m_backend.data._M_elems[0x10] = 0;
    local_3d8.left.m_backend.data._M_elems[0x11] = 0;
    local_3d8.left.m_backend.data._M_elems[0x12] = 0;
    local_3d8.left.m_backend.data._M_elems[0x13] = 0;
    local_3d8.left.m_backend.data._M_elems[0x14] = 0;
    local_3d8.left.m_backend.data._M_elems[0x15] = 0;
    local_3d8.left.m_backend.data._M_elems[0x16] = 0;
    local_3d8.left.m_backend.data._M_elems[0x17] = 0;
    local_3d8.left.m_backend.data._M_elems[0x18] = 0;
    local_3d8.left.m_backend.data._M_elems[0x19] = 0;
    local_3d8.left.m_backend.data._M_elems._104_5_ = 0;
    local_3d8.left.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_3d8.left.m_backend.exp = 0;
    local_3d8.left.m_backend.neg = false;
    uStack_470 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_3d8,(double)local_478);
    if (((pcVar16->fpclass != cpp_dec_float_NaN) &&
        (local_3d8.left.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar16,(cpp_dec_float<200U,_int,_void> *)&local_3d8), iVar6 < 0)) {
      pnVar4 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar11 = pnVar4 + iVar2;
      psVar14 = local_b0;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        *(undefined4 *)psVar14 = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
        psVar14 = psVar14 + (ulong)bVar17 * -8 + 4;
      }
      local_40 = pnVar4[iVar2].m_backend.exp;
      local_3c = pnVar4[iVar2].m_backend.neg;
      local_38._0_4_ = pnVar4[iVar2].m_backend.fpclass;
      local_38._4_4_ = pnVar4[iVar2].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_3d8,local_b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)-local_488,(undefined4)local_38);
      pnVar4 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar12 = &local_3d8;
      pnVar11 = pnVar4 + iVar2;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pLVar12->left).m_backend.data._M_elems[0];
        pLVar12 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pLVar12 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      pnVar4[iVar2].m_backend.exp = local_3d8.left.m_backend.exp;
      pnVar4[iVar2].m_backend.neg = local_3d8.left.m_backend.neg;
      pnVar4[iVar2].m_backend.fpclass = local_3d8.left.m_backend.fpclass;
      pnVar4[iVar2].m_backend.prec_elem = local_3d8.left.m_backend.prec_elem;
    }
    pcVar16 = &(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend;
    ::soplex::infinity::__tls_init();
    local_3d8.left.m_backend.fpclass = cpp_dec_float_finite;
    local_3d8.left.m_backend.prec_elem = 0x1c;
    local_3d8.left.m_backend.data._M_elems[0] = 0;
    local_3d8.left.m_backend.data._M_elems[1] = 0;
    local_3d8.left.m_backend.data._M_elems[2] = 0;
    local_3d8.left.m_backend.data._M_elems[3] = 0;
    local_3d8.left.m_backend.data._M_elems[4] = 0;
    local_3d8.left.m_backend.data._M_elems[5] = 0;
    local_3d8.left.m_backend.data._M_elems[6] = 0;
    local_3d8.left.m_backend.data._M_elems[7] = 0;
    local_3d8.left.m_backend.data._M_elems[8] = 0;
    local_3d8.left.m_backend.data._M_elems[9] = 0;
    local_3d8.left.m_backend.data._M_elems[10] = 0;
    local_3d8.left.m_backend.data._M_elems[0xb] = 0;
    local_3d8.left.m_backend.data._M_elems[0xc] = 0;
    local_3d8.left.m_backend.data._M_elems[0xd] = 0;
    local_3d8.left.m_backend.data._M_elems[0xe] = 0;
    local_3d8.left.m_backend.data._M_elems[0xf] = 0;
    local_3d8.left.m_backend.data._M_elems[0x10] = 0;
    local_3d8.left.m_backend.data._M_elems[0x11] = 0;
    local_3d8.left.m_backend.data._M_elems[0x12] = 0;
    local_3d8.left.m_backend.data._M_elems[0x13] = 0;
    local_3d8.left.m_backend.data._M_elems[0x14] = 0;
    local_3d8.left.m_backend.data._M_elems[0x15] = 0;
    local_3d8.left.m_backend.data._M_elems[0x16] = 0;
    local_3d8.left.m_backend.data._M_elems[0x17] = 0;
    local_3d8.left.m_backend.data._M_elems[0x18] = 0;
    local_3d8.left.m_backend.data._M_elems[0x19] = 0;
    local_3d8.left.m_backend.data._M_elems._104_5_ = 0;
    local_3d8.left.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_3d8.left.m_backend.exp = 0;
    local_3d8.left.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_3d8,-(double)local_478);
    if (((pcVar16->fpclass != cpp_dec_float_NaN) &&
        (local_3d8.left.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar16,(cpp_dec_float<200U,_int,_void> *)&local_3d8), 0 < iVar6)) {
      pnVar4 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar11 = pnVar4 + iVar2;
      psVar14 = local_130;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        *(undefined4 *)psVar14 = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
        psVar14 = psVar14 + (ulong)bVar17 * -8 + 4;
      }
      local_c0 = pnVar4[iVar2].m_backend.exp;
      local_bc = pnVar4[iVar2].m_backend.neg;
      local_b8._0_4_ = pnVar4[iVar2].m_backend.fpclass;
      local_b8._4_4_ = pnVar4[iVar2].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_3d8,local_130,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)-local_488,(undefined4)local_b8);
      pnVar4 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar12 = &local_3d8;
      pnVar11 = pnVar4 + iVar2;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pLVar12->left).m_backend.data._M_elems[0];
        pLVar12 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pLVar12 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      pnVar4[iVar2].m_backend.exp = local_3d8.left.m_backend.exp;
      pnVar4[iVar2].m_backend.neg = local_3d8.left.m_backend.neg;
      pnVar4[iVar2].m_backend.fpclass = local_3d8.left.m_backend.fpclass;
      pnVar4[iVar2].m_backend.prec_elem = local_3d8.left.m_backend.prec_elem;
    }
    pnVar4 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar11 = pnVar4 + iVar2;
    psVar14 = local_1b0;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      *(undefined4 *)psVar14 = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
      psVar14 = psVar14 + (ulong)bVar17 * -8 + 4;
    }
    local_140 = pnVar4[iVar2].m_backend.exp;
    local_13c = pnVar4[iVar2].m_backend.neg;
    local_138._0_4_ = pnVar4[iVar2].m_backend.fpclass;
    local_138._4_4_ = pnVar4[iVar2].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&local_3d8,local_1b0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)local_488,(undefined4)local_138);
    pnVar4 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar12 = &local_3d8;
    pnVar11 = pnVar4 + iVar2;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = (pLVar12->left).m_backend.data._M_elems[0];
      pLVar12 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pLVar12 + ((ulong)bVar17 * -2 + 1) * 4);
      pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    pnVar4[iVar2].m_backend.exp = local_3d8.left.m_backend.exp;
    pnVar4[iVar2].m_backend.neg = local_3d8.left.m_backend.neg;
    pnVar4[iVar2].m_backend.fpclass = local_3d8.left.m_backend.fpclass;
    pnVar4[iVar2].m_backend.prec_elem = local_3d8.left.m_backend.prec_elem;
    (this->
    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).scaleExp.data[iVar2] = local_488;
  }
  else {
    local_488 = 0;
  }
  pIVar10 = (this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem;
  iVar2 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[iVar2].idx;
  lVar8 = (long)pIVar10[iVar2].data.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused;
  if (0 < lVar8) {
    pIVar10 = pIVar10 + iVar2;
    local_478 = pIVar10;
    do {
      lVar1 = lVar8 + -1;
      pNVar7 = (pIVar10->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar2 = pNVar7[lVar8 + -1].idx;
      if (scale) {
        pNVar13 = pNVar7 + lVar1;
        psVar14 = local_230;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *(undefined4 *)psVar14 = (pNVar13->val).m_backend.data._M_elems[0];
          pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar13 + ((ulong)bVar17 * -2 + 1) * 4);
          psVar14 = psVar14 + (ulong)bVar17 * -8 + 4;
        }
        local_1c0 = pNVar7[lVar1].val.m_backend.exp;
        local_1bc = pNVar7[lVar1].val.m_backend.neg;
        local_1b8._0_4_ = pNVar7[lVar1].val.m_backend.fpclass;
        local_1b8._4_4_ = pNVar7[lVar1].val.m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_3d8,local_230,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)((this->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).scaleExp.data[iVar2] + local_488),
                   CONCAT31((int3)((uint)local_1c0 >> 8),local_1bc));
        pNVar7 = (local_478->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        pLVar12 = &local_3d8;
        pNVar13 = pNVar7 + lVar1;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pNVar13->val).m_backend.data._M_elems[0] = (pLVar12->left).m_backend.data._M_elems[0];
          pLVar12 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pLVar12 + (ulong)bVar17 * -8 + 4);
          pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar13 + ((ulong)bVar17 * -2 + 1) * 4);
        }
        pNVar7[lVar1].val.m_backend.exp = local_3d8.left.m_backend.exp;
        pNVar7[lVar1].val.m_backend.neg = local_3d8.left.m_backend.neg;
        pNVar7[lVar1].val.m_backend.fpclass = local_3d8.left.m_backend.fpclass;
        pNVar7[lVar1].val.m_backend.prec_elem = local_3d8.left.m_backend.prec_elem;
        pNVar7 = (local_478->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        pIVar10 = local_478;
      }
      pNVar13 = pNVar7 + lVar1;
      pnVar15 = &local_458;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar15->m_backend).data._M_elems[0] = (pNVar13->val).m_backend.data._M_elems[0];
        pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar13 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_458.m_backend.exp = pNVar7[lVar1].val.m_backend.exp;
      local_458.m_backend.neg = pNVar7[lVar1].val.m_backend.neg;
      local_458.m_backend.fpclass = pNVar7[lVar1].val.m_backend.fpclass;
      local_458.m_backend.prec_elem = pNVar7[lVar1].val.m_backend.prec_elem;
      if ((this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum <= iVar2) {
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::LPRowBase(&local_3d8,0);
        iVar6 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum;
        if (iVar6 <= iVar2) {
          iVar6 = (iVar2 - iVar6) + 1;
          do {
            local_460.info = 0;
            local_460.idx = -1;
            LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(&this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&local_460,&local_3d8);
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
        local_3d8.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
        pIVar10 = local_478;
        if (local_3d8.vec.theelem !=
            (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          free(local_3d8.vec.theelem);
          pIVar10 = local_478;
        }
      }
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(&this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,iVar2,1,&local_47c,&local_458);
      bVar5 = 1 < lVar8;
      lVar8 = lVar1;
    } while (bVar5);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])(this,1);
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - iVar3));
  return;
}

Assistant:

void doAddCol(const R& objValue, const R& lowerValue, const SVectorBase<R>& colVec,
                 const R& upperValue, bool scale = false)
   {
      int idx = nCols();
      int oldRowNumber = nRows();
      int newColScaleExp = 0;

      LPColSetBase<R>::add(objValue, lowerValue, colVec, upperValue);

      if(thesense != MAXIMIZE)
         LPColSetBase<R>::maxObj_w(idx) *= -1;

      DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

      // compute new column scaling factor and apply it to the bounds
      if(scale)
      {
         newColScaleExp = lp_scaler->computeScaleExp(colVec, rowscaleExp);

         if(upper(idx) < R(infinity))
            upper_w(idx) = spxLdexp(upper_w(idx), - newColScaleExp);

         if(lower(idx) > R(-infinity))
            lower_w(idx) = spxLdexp(lower_w(idx), - newColScaleExp);

         maxObj_w(idx) = spxLdexp(maxObj_w(idx), newColScaleExp);

         LPColSetBase<R>::scaleExp[idx] = newColScaleExp;
      }

      SVectorBase<R>& vec = colVector_w(idx);

      // now insert nonzeros to row file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[i]);

         R val = vec.value(j);

         // create new rows if required
         if(i >= nRows())
         {
            LPRowBase<R> empty;

            for(int k = nRows(); k <= i; ++k)
               LPRowSetBase<R>::add(empty);
         }

         assert(i < nRows());
         LPRowSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedCols(1);
      addedRows(nRows() - oldRowNumber);
   }